

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Hop_Obj_t * Abc_ObjHopFromGia(Hop_Man_t *pHopMan,Gia_Man_t *p,int GiaId,Vec_Ptr_t *vCopies)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  Hop_Obj_t *pHVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  
  if (-1 < GiaId) {
    iVar3 = p->vMapping->nSize;
    if (GiaId < iVar3) {
      piVar2 = p->vMapping->pArray;
      uVar1 = piVar2[(uint)GiaId];
      if ((ulong)uVar1 == 0) {
        __assert_fail("Gia_ObjIsLut(p, GiaId)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                      ,0x2b5,
                      "Hop_Obj_t *Abc_ObjHopFromGia(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)");
      }
      if ((-1 < (int)uVar1) && ((int)uVar1 < iVar3)) {
        if (piVar2[uVar1] < 1) {
          __assert_fail("Gia_ObjLutSize(p, GiaId) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0x2b6,
                        "Hop_Obj_t *Abc_ObjHopFromGia(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)");
        }
        Gia_ManIncrementTravId(p);
        pVVar5 = p->vMapping;
        iVar3 = pVVar5->nSize;
        if (GiaId < iVar3) {
          lVar7 = 0;
          do {
            piVar2 = pVVar5->pArray;
            lVar6 = (long)piVar2[(uint)GiaId];
            if ((lVar6 < 0) || (iVar3 <= piVar2[(uint)GiaId])) break;
            if (piVar2[lVar6] <= lVar7) {
              pHVar4 = Abc_ObjHopFromGia_rec(pHopMan,p,GiaId,vCopies);
              return pHVar4;
            }
            iVar3 = piVar2[lVar6 + lVar7 + 1];
            if (p->nTravIdsAlloc <= iVar3) {
              __assert_fail("Id < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
            }
            p->pTravIds[iVar3] = p->nTravIds;
            pHVar4 = Hop_IthVar(pHopMan,(int)lVar7);
            if ((iVar3 < 0) || (vCopies->nSize <= iVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            vCopies->pArray[iVar3] = pHVar4;
            lVar7 = lVar7 + 1;
            pVVar5 = p->vMapping;
            iVar3 = pVVar5->nSize;
          } while (GiaId < iVar3);
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Hop_Obj_t * Abc_ObjHopFromGia( Hop_Man_t * pHopMan, Gia_Man_t * p, int GiaId, Vec_Ptr_t * vCopies )
{
    int k, iFan;
    assert( Gia_ObjIsLut(p, GiaId) );
    assert( Gia_ObjLutSize(p, GiaId) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_LutForEachFanin( p, GiaId, iFan, k )
    {
        Gia_ObjSetTravIdCurrentId(p, iFan);
        Vec_PtrWriteEntry( vCopies, iFan, Hop_IthVar(pHopMan, k) );
    }
    return Abc_ObjHopFromGia_rec( pHopMan, p, GiaId, vCopies );
}